

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O1

bool __thiscall Divide<1,_0,_1>::check(Divide<1,_0,_1> *this)

{
  IntVar *pIVar1;
  IntVar *pIVar2;
  long lVar3;
  
  pIVar1 = (this->x).var;
  pIVar2 = (this->y).var;
  lVar3 = (long)(&pIVar2->min)[(ulong)pIVar2->in_scip * 4].v;
  pIVar2 = (this->z).var;
  return (-(&pIVar1->min)[(ulong)pIVar1->in_scip * 4].v + lVar3 + -1) / lVar3 ==
         (long)-(&pIVar2->min)[(ulong)pIVar2->in_scip * 4].v;
}

Assistant:

int64_t getShadowVal() const {
		int64_t v = (type & 1) != 0 ? -var->getShadowVal() : var->getShadowVal();
		if ((type & 2) != 0) {
			v *= a;
		}
		if ((type & 4) != 0) {
			v += b;
		}
		return v;
	}